

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,span<const_unsigned_char,__1L> *s)

{
  descriptor<pstore::details::posix_descriptor_traits> *pdVar1;
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&> local_40;
  descriptor<pstore::details::posix_descriptor_traits> *local_28;
  span<const_unsigned_char,__1L> *s_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_28 = io._M_data;
  s_local = (span<const_unsigned_char,__1L> *)this;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  pdVar1 = std::reference_wrapper::operator_cast_to_descriptor_((reference_wrapper *)&sender_local);
  (*(code *)this)(&local_40,pdVar1,local_28);
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
  ::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,void>
            ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              *)__return_storage_ptr__,&local_40);
  error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::~error_or
            (&local_40);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send (Sender sender, IO io, gsl::span<std::uint8_t const> const & s) {
            return sender (io, s);
        }